

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_floatval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  double Value;
  
  if (nArg < 1) {
    Value = 0.0;
  }
  else {
    Value = jx9_value_to_double(*apArg);
  }
  jx9_result_double(pCtx,Value);
  return 0;
}

Assistant:

static int jx9Builtin_floatval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return 0.0 */
		jx9_result_double(pCtx, 0);
	}else{
		double dval;
		/* Perform the cast */
		dval = jx9_value_to_double(apArg[0]);
		jx9_result_double(pCtx, dval);
	}
	return JX9_OK;
}